

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::printFieldName
          (PrintExpressionContents *this,HeapType type,Index index)

{
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *this_00;
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  TypeNames local_a8;
  undefined1 local_60 [8];
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  names;
  
  PrintSExpression::TypePrinter::getNames(&local_a8,&this->parent->typePrinter,type);
  this_00 = &local_a8.fieldNames;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)local_60,this_00,this_00);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  p_Var2 = *(__buckets_ptr)((long)local_60 + ((ulong)index % (ulong)names._M_h._M_buckets) * 8);
  p_Var3 = (__node_base_ptr)0x0;
  if ((p_Var2 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var2->_M_nxt, p_Var3 = p_Var2, *(Index *)&p_Var2->_M_nxt[1]._M_nxt != index)) {
    while (p_Var2 = p_Var1, p_Var1 = p_Var2->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var3 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % (ulong)names._M_h._M_buckets !=
           (ulong)index % (ulong)names._M_h._M_buckets) ||
         (p_Var3 = p_Var2, *(uint *)&p_Var1[1]._M_nxt == index)) goto LAB_00a44f40;
    }
    p_Var3 = (__node_base_ptr)0x0;
  }
LAB_00a44f40:
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var1 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var1 = p_Var3->_M_nxt;
  }
  if (p_Var1 == (_Hash_node_base *)0x0) {
    std::ostream::_M_insert<unsigned_long>((ulong)this->o);
  }
  else {
    Name::print((Name *)(p_Var1 + 2),this->o);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_60);
  return;
}

Assistant:

void printFieldName(HeapType type, Index index) {
    auto names = parent.typePrinter.getNames(type).fieldNames;
    if (auto it = names.find(index); it != names.end()) {
      it->second.print(o);
    } else {
      o << index;
    }
  }